

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  
  fVar1 = window->WindowBorderSize;
  fVar7 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (axis == ImGuiAxis_X) {
    fVar3 = (window->Pos).y;
    fVar2 = (window->InnerRect).Min.x;
    fVar6 = ((window->Size).y + fVar3) - fVar1;
    fVar7 = fVar6 - fVar7;
    uVar4 = -(uint)(fVar7 <= fVar3);
    fVar3 = (float)(uVar4 & (uint)fVar3 | ~uVar4 & (uint)fVar7);
    fVar5 = (window->InnerRect).Max.x - fVar1;
  }
  else {
    fVar2 = (window->Pos).x;
    fVar3 = (window->InnerRect).Min.y;
    fVar5 = ((window->Size).x + fVar2) - fVar1;
    fVar7 = fVar5 - fVar7;
    uVar4 = -(uint)(fVar7 <= fVar2);
    fVar2 = (float)(uVar4 & (uint)fVar2 | ~uVar4 & (uint)fVar7);
    fVar6 = (window->InnerRect).Max.y - fVar1;
  }
  IVar8.Max.y = fVar6;
  IVar8.Max.x = fVar5;
  IVar8.Min.y = fVar3;
  IVar8.Min.x = fVar2;
  return IVar8;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x - border_size, outer_rect.Max.y - border_size);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x - border_size, inner_rect.Max.y - border_size);
}